

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_iswxdigit(char16_t c)

{
  int local_10;
  UINT nRetVal;
  char16_t c_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (((((ushort)c < 0x41) || (0x46 < (ushort)c)) && (((ushort)c < 0x61 || (0x66 < (ushort)c)))) &&
     (((ushort)c < 0x30 || (0x39 < (ushort)c)))) {
    if (((((ushort)c < 0xff10) || (0xff19 < (ushort)c)) &&
        (((ushort)c < 0xff21 || (0xff26 < (ushort)c)))) &&
       (((ushort)c < 0xff41 || (0xff46 < (ushort)c)))) {
      local_10 = 0;
    }
    else {
      local_10 = 1;
    }
  }
  else {
    local_10 = 1;
  }
  if (PAL_InitializeChakraCoreCalled) {
    return local_10;
  }
  abort();
}

Assistant:

int
__cdecl
PAL_iswxdigit( char16_t c )
{
    UINT nRetVal = 0;

    PERF_ENTRY(iswxdigit);
    ENTRY("PAL_iswxdigit( c=%d )\n", c);

    /* ASCII characters */
    if((c>= 'A' && c<='F') ||        /* uppercase hex letters */
       (c>= 'a' && c<='f') ||        /* lowercase hex letters */
       (c>= '0' && c<='9'))          /* digits */
    {
        nRetVal = 1;
    }
    else
    /* "fullwidth" characters, whatever that is */
    if((c>= 0xFF10 && c<=0xFF19) ||  /* digits */
       (c>= 0xFF21 && c<=0xFF26) ||  /* uppercase hex letters */
       (c>= 0xFF41 && c<=0xFF46))    /* lowercase hex letters */
    {
        nRetVal = 1;
    }
    else
    {
        nRetVal = 0;
    }
    LOGEXIT("PAL_iswxdigit returning %d\n", nRetVal);
    PERF_EXIT(iswxdigit);
    return nRetVal;
}